

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O0

int bip32_privkey_tweak_add(uchar *tweak,size_t tweak_len,ext_key *key_out)

{
  _Bool _Var1;
  int iVar2;
  ext_key *key_out_local;
  size_t tweak_len_local;
  uchar *tweak_local;
  
  if (((tweak == (uchar *)0x0) || (tweak_len != 0x20)) || (key_out == (ext_key *)0x0)) {
    tweak_local._4_4_ = -2;
  }
  else {
    _Var1 = mem_is_zero(key_out->pub_key_tweak_sum,0x20);
    if (_Var1) {
      memcpy(key_out->pub_key_tweak_sum,tweak,0x20);
      tweak_local._4_4_ = 0;
    }
    else {
      iVar2 = privkey_tweak_add(key_out->pub_key_tweak_sum,tweak);
      tweak_local._4_4_ = -2;
      if (iVar2 != 0) {
        tweak_local._4_4_ = 0;
      }
    }
  }
  return tweak_local._4_4_;
}

Assistant:

static int bip32_privkey_tweak_add(const unsigned char *tweak, size_t tweak_len,
                                   struct ext_key *key_out)
{
    if (!tweak || tweak_len != sizeof(key_out->pub_key_tweak_sum) || !key_out)
        return WALLY_EINVAL;

    if (!mem_is_zero(key_out->pub_key_tweak_sum, tweak_len))
        return privkey_tweak_add(key_out->pub_key_tweak_sum, tweak) ? WALLY_OK : WALLY_EINVAL;

    /* tweak sum is zero: start with the tweak */
    memcpy(key_out->pub_key_tweak_sum, tweak, tweak_len);
    return WALLY_OK;
}